

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-utils.h
# Opt level: O2

_Bool plutovg_skip_ws_or_comma(char **begin,char *end,_Bool *has_comma)

{
  char *pcVar1;
  _Bool _Var2;
  char *it;
  char *local_28;
  
  pcVar1 = *begin;
  local_28 = pcVar1;
  _Var2 = plutovg_skip_ws(&local_28,end);
  if ((local_28 < end && _Var2) && (*local_28 == ',')) {
    local_28 = local_28 + 1;
    _Var2 = plutovg_skip_ws(&local_28,end);
  }
  if (local_28 != pcVar1) {
    *begin = local_28;
  }
  return _Var2;
}

Assistant:

static inline bool plutovg_skip_ws_or_comma(const char** begin, const char* end, bool* has_comma)
{
    return plutovg_skip_ws_or_delim(begin, end, ',', has_comma);
}